

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_loadDictionaryContent
                 (ZSTD_matchState_t *ms,ldmState_t *ls,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,
                 void *src,size_t srcSize,ZSTD_dictTableLoadMethod_e dtlm)

{
  BYTE *iend;
  uint uVar1;
  ulong uVar2;
  undefined4 extraout_var;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  undefined4 extraout_var_00;
  ulong srcSize_00;
  int iVar3;
  U32 UVar4;
  U32 UVar5;
  BYTE *ip;
  bool bVar6;
  
  iend = (BYTE *)((long)src + srcSize);
  bVar6 = (params->ldmParams).enableLdm != 0;
  srcSize_00 = 0xdfffffff;
  if (srcSize < 0xdfffffff) {
    srcSize_00 = srcSize;
  }
  if (srcSize < 0x20000000) {
    srcSize_00 = srcSize;
  }
  ip = iend + -0xdfffffff;
  if (srcSize >> 0x1d < 7) {
    ip = (BYTE *)src;
  }
  UVar4 = 0;
  ZSTD_window_update(&ms->window,ip,srcSize_00,0);
  iVar3 = (int)iend;
  if (params->forceWindow == 0) {
    UVar4 = iVar3 - *(int *)&(ms->window).base;
  }
  ms->loadedDictEnd = UVar4;
  uVar2 = (ulong)(uint)params->deterministicRefPrefix;
  ms->forceNonContiguous = params->deterministicRefPrefix;
  if (ls != (ldmState_t *)0x0 && bVar6) {
    UVar5 = 0;
    UVar4 = ZSTD_window_update(&ls->window,ip,srcSize_00,0);
    uVar2 = CONCAT44(extraout_var,UVar4);
    if (params->forceWindow == 0) {
      uVar1 = *(uint *)&(ls->window).base;
      uVar2 = (ulong)uVar1;
      UVar5 = iVar3 - uVar1;
    }
    ls->loadedDictEnd = UVar5;
  }
  if (8 < srcSize_00) {
    ZSTD_overflowCorrectIfNeeded(ms,ws,params,ip,iend);
    if (ls != (ldmState_t *)0x0 && bVar6) {
      ZSTD_ldm_fillHashTable(ls,ip,iend,&params->ldmParams);
    }
    uVar2 = (ulong)((params->cParams).strategy - ZSTD_fast);
    switch(uVar2) {
    case 0:
      ZSTD_fillHashTable(ms,iend,dtlm);
      uVar2 = extraout_RAX_02;
      break;
    case 1:
      ZSTD_fillDoubleHashTable(ms,iend,dtlm);
      uVar2 = extraout_RAX_03;
      break;
    case 2:
    case 3:
    case 4:
      if (ms->dedicatedDictSearch == 0) {
        if (params->useRowMatchFinder == ZSTD_urm_enableRowMatchFinder) {
          memset(ms->tagTable,0,2L << ((byte)(params->cParams).hashLog & 0x3f));
          ZSTD_row_update(ms,iend + -8);
          uVar2 = extraout_RAX_01;
        }
        else {
          UVar4 = ZSTD_insertAndFindFirstIndex(ms,iend + -8);
          uVar2 = CONCAT44(extraout_var_00,UVar4);
        }
      }
      else {
        ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms,iend + -8);
        uVar2 = extraout_RAX_00;
      }
      break;
    case 5:
    case 6:
    case 7:
    case 8:
      ZSTD_updateTree(ms,iend + -8,iend);
      uVar2 = extraout_RAX;
    }
    ms->nextToUpdate = iVar3 - *(int *)&(ms->window).base;
  }
  return uVar2;
}

Assistant:

static size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t* ms,
                                         ldmState_t* ls,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         const void* src, size_t srcSize,
                                         ZSTD_dictTableLoadMethod_e dtlm)
{
    const BYTE* ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    int const loadLdmDict = params->ldmParams.enableLdm && ls != NULL;

    /* Assert that we the ms params match the params we're being given */
    ZSTD_assertEqualCParams(params->cParams, ms->cParams);

    if (srcSize > ZSTD_CHUNKSIZE_MAX) {
        /* Allow the dictionary to set indices up to exactly ZSTD_CURRENT_MAX.
         * Dictionaries right at the edge will immediately trigger overflow
         * correction, but I don't want to insert extra constraints here.
         */
        U32 const maxDictSize = ZSTD_CURRENT_MAX - 1;
        /* We must have cleared our windows when our source is this large. */
        assert(ZSTD_window_isEmpty(ms->window));
        if (loadLdmDict)
            assert(ZSTD_window_isEmpty(ls->window));
        /* If the dictionary is too large, only load the suffix of the dictionary. */
        if (srcSize > maxDictSize) {
            ip = iend - maxDictSize;
            src = ip;
            srcSize = maxDictSize;
        }
    }

    DEBUGLOG(4, "ZSTD_loadDictionaryContent(): useRowMatchFinder=%d", (int)params->useRowMatchFinder);
    ZSTD_window_update(&ms->window, src, srcSize, /* forceNonContiguous */ 0);
    ms->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ms->window.base);
    ms->forceNonContiguous = params->deterministicRefPrefix;

    if (loadLdmDict) {
        ZSTD_window_update(&ls->window, src, srcSize, /* forceNonContiguous */ 0);
        ls->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ls->window.base);
    }

    if (srcSize <= HASH_READ_SIZE) return 0;

    ZSTD_overflowCorrectIfNeeded(ms, ws, params, ip, iend);

    if (loadLdmDict)
        ZSTD_ldm_fillHashTable(ls, ip, iend, &params->ldmParams);

    switch(params->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, iend, dtlm);
        break;
    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, iend, dtlm);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
        assert(srcSize >= HASH_READ_SIZE);
        if (ms->dedicatedDictSearch) {
            assert(ms->chainTable != NULL);
            ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms, iend-HASH_READ_SIZE);
        } else {
            assert(params->useRowMatchFinder != ZSTD_urm_auto);
            if (params->useRowMatchFinder == ZSTD_urm_enableRowMatchFinder) {
                size_t const tagTableSize = ((size_t)1 << params->cParams.hashLog) * sizeof(U16);
                ZSTD_memset(ms->tagTable, 0, tagTableSize);
                ZSTD_row_update(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using row-based hash table for lazy dict");
            } else {
                ZSTD_insertAndFindFirstIndex(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using chain-based hash table for lazy dict");
            }
        }
        break;

    case ZSTD_btlazy2:   /* we want the dictionary table fully sorted */
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
        assert(srcSize >= HASH_READ_SIZE);
        ZSTD_updateTree(ms, iend-HASH_READ_SIZE, iend);
        break;

    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    ms->nextToUpdate = (U32)(iend - ms->window.base);
    return 0;
}